

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::runContinuation(QFutureInterfaceBase *this)

{
  __pointer_type pQVar1;
  QFutureInterfaceBasePrivate *pQVar2;
  _Manager_type p_Var3;
  undefined8 uVar4;
  QBasicMutex *this_00;
  long in_FS_OFFSET;
  bool bVar5;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->d->continuationMutex;
  if ((this->d->continuationMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar5) goto LAB_003cf1b5;
  }
  else {
LAB_003cf1b5:
    QBasicMutex::lockInternal(this_00);
  }
  pQVar2 = this->d;
  p_Var3 = (pQVar2->continuation).super__Function_base._M_manager;
  if ((p_Var3 != (_Manager_type)0x0) && (pQVar2->continuationExecuted == false)) {
    if (pQVar2->continuationData != (QFutureInterfaceBasePrivate *)0x0) {
      pQVar2->continuationData->nonConcludedParent = (QFutureInterfaceBasePrivate *)0x0;
    }
    pQVar2->continuationExecuted = true;
    local_20 = (pQVar2->continuation)._M_invoker;
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(pQVar2->continuation).super__Function_base._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(pQVar2->continuation).super__Function_base._M_functor + 8);
    (pQVar2->continuation).super__Function_base._M_manager = (_Manager_type)0x0;
    (pQVar2->continuation)._M_invoker = (_Invoker_type)0x0;
    LOCK();
    pQVar1 = (this_00->d_ptr)._q_value._M_b._M_p;
    (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    local_28 = p_Var3;
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(this_00,pQVar1);
    }
    if (local_28 == (_Manager_type)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar4 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar4);
      }
      goto LAB_003cf320;
    }
    (*local_20)(&local_38,this);
    if ((this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar5 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar5) {
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar5) goto LAB_003cf266;
    }
    else {
LAB_003cf266:
      QBasicMutex::lockInternal(this_00);
    }
    if ((this->d->continuationState)._M_i != Cleaned) {
      std::function<void_(const_QFutureInterfaceBase_&)>::operator=
                (&this->d->continuation,(function<void_(const_QFutureInterfaceBase_&)> *)&local_38);
    }
    if (local_28 != (_Manager_type)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  LOCK();
  pQVar1 = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003cf320:
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::runContinuation() const
{
    QMutexLocker lock(&d->continuationMutex);
    if (d->continuation && !d->continuationExecuted) {
        // If we run the next continuation, then this future is concluded, so
        // we wouldn't need to revisit it in the cancelChain()
        if (d->continuationData)
            d->continuationData->nonConcludedParent = nullptr;
        // Save the continuation in a local function, to avoid calling
        // a null std::function below, in case cleanContinuation() is
        // called from some other thread right after unlock() below.
        d->continuationExecuted = true;
        auto fn = std::move(d->continuation);
        lock.unlock();
        fn(*this);

        lock.relock();
        // Unless the continuation has been cleaned earlier, we have to
        // store the move-only continuation, to guarantee that the associated
        // future's data stays alive.
        if (d->continuationState != QFutureInterfaceBasePrivate::Cleaned)
            d->continuation = std::move(fn);
    }
}